

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O3

void __thiscall
QHttp2ProtocolHandler::_q_uploadDataDestroyed(QHttp2ProtocolHandler *this,QObject *uploadData)

{
  int *piVar1;
  long in_FS_OFFSET;
  int *local_28;
  QHttp2Stream *pQStack_20;
  QObject *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QHttp2Stream *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = uploadData;
  QHash<QObject*,QPointer<QHttp2Stream>>::takeImpl<QObject*>
            ((QHash<QObject*,QPointer<QHttp2Stream>> *)&local_28,(QObject **)(this + 0x48));
  if (local_28 != (int *)0x0) {
    if (((pQStack_20 != (QHttp2Stream *)0x0 && local_28[1] != 0) &&
        (*(int *)(pQStack_20 + 0x68) != 0)) && (*(int *)(pQStack_20 + 0x68) != 5)) {
      QHttp2Stream::sendRST_STREAM(pQStack_20,CANCEL);
      if (local_28 == (int *)0x0) goto LAB_001f3b6c;
    }
    LOCK();
    *local_28 = *local_28 + -1;
    UNLOCK();
    if (*local_28 == 0) {
      piVar1 = local_28;
      if (local_28 == (int *)0x0) {
        piVar1 = (int *)0x0;
      }
      operator_delete(piVar1);
    }
  }
LAB_001f3b6c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::_q_uploadDataDestroyed(QObject *uploadData)
{
    QPointer<QHttp2Stream> stream = streamIDs.take(uploadData);
    if (stream && stream->isActive())
        stream->sendRST_STREAM(CANCEL);
}